

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mingw_make.cpp
# Opt level: O3

void __thiscall
MingwMakefileGenerator::writeObjectsPart(MingwMakefileGenerator *this,QTextStream *t)

{
  int iVar1;
  QArrayData *pQVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  QMakeProject *pQVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QStringView config;
  QArrayData *local_138;
  char16_t *pcStack_130;
  qsizetype local_128;
  QArrayData *local_118;
  char16_t *pcStack_110;
  qsizetype local_108;
  QString local_f8;
  QArrayData local_d8;
  char16_t *local_c8;
  ProKey local_b8;
  undefined1 local_88 [16];
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  char (*local_60) [3];
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MakefileGenerator::maybeCreateLinkerResponseFile
            ((LinkerResponseFileInfo *)local_88,(MakefileGenerator *)this);
  pQVar2 = &((this->linkerResponseFile).filePath.d.d)->super_QArrayData;
  pQVar3 = (QArrayData *)(this->linkerResponseFile).filePath.d.ptr;
  (this->linkerResponseFile).filePath.d.d = (Data *)local_88._0_8_;
  (this->linkerResponseFile).filePath.d.ptr = (char16_t *)local_88._8_8_;
  pQVar4 = (QArrayData *)(this->linkerResponseFile).filePath.d.size;
  (this->linkerResponseFile).filePath.d.size = (qsizetype)local_78;
  (this->linkerResponseFile).onlyObjects = pcStack_70._0_1_;
  local_88._0_8_ = pQVar2;
  local_88._8_8_ = pQVar3;
  local_78 = pQVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if ((this->linkerResponseFile).filePath.d.size == 0) {
    QVar14.m_size = (size_t)"$(OBJECTS)";
    QVar14.field_0.m_data = &this->objectsLinkLine;
    QString::assign(QVar14);
    goto LAB_001e12ea;
  }
  pQVar5 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  QVar12.m_data = (storage_type *)0x9;
  QVar12.m_size = (qsizetype)local_88;
  QString::fromUtf8(QVar12);
  uVar8 = local_88._0_8_;
  bVar11 = false;
  config.m_data = (storage_type_conflict *)local_88._8_8_;
  config.m_size = (qsizetype)local_78;
  bVar10 = QMakeEvaluator::isActiveConfig(&pQVar5->super_QMakeEvaluator,config,false);
  if (bVar10) {
    pQVar5 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_b8,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_88,&pQVar5->super_QMakeEvaluator,&local_b8);
    bVar11 = ProString::operator==((ProString *)local_88,"lib");
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
    }
  }
  if (bVar11 == false) {
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0xc])(&local_d8,this,&this->linkerResponseFile);
    pcStack_70 = local_c8;
    local_78 = (QArrayData *)local_d8.alloc;
    uVar8 = local_d8._0_8_;
    local_88._0_8_ = "@";
    local_d8._0_8_ = (QArrayData *)0x0;
    uVar9 = local_d8._0_8_;
    local_d8.alloc = 0;
    local_d8.ref_._q_value.super___atomic_base<int>._M_i = SUB84(uVar8,0);
    local_d8.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = SUB84(uVar8,4);
    local_88._8_4_ = local_d8.ref_._q_value.super___atomic_base<int>._M_i;
    local_88._12_4_ =
         local_d8.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i;
    local_c8 = (char16_t *)0x0;
    local_d8._0_8_ = uVar9;
    QStringBuilder<const_char_(&)[2],_QString>::convertTo<QString>
              ((QString *)&local_b8,(QStringBuilder<const_char_(&)[2],_QString> *)local_88);
    pQVar2 = &((this->objectsLinkLine).d.d)->super_QArrayData;
    pcVar6 = (this->objectsLinkLine).d.ptr;
    (this->objectsLinkLine).d.d = local_b8.super_ProString.m_string.d.d;
    (this->objectsLinkLine).d.ptr = local_b8.super_ProString.m_string.d.ptr;
    qVar7 = (this->objectsLinkLine).d.size;
    (this->objectsLinkLine).d.size = local_b8.super_ProString.m_string.d.size;
    local_b8.super_ProString.m_string.d.d = (Data *)pQVar2;
    local_b8.super_ProString.m_string.d.ptr = pcVar6;
    local_b8.super_ProString.m_string.d.size = qVar7;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if ((QArrayData *)local_88._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      iVar1 = (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar2 = (QArrayData *)local_88._8_8_;
      goto joined_r0x001e12a8;
    }
  }
  else {
    local_c8 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_d8.alloc = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)local_88,"QMAKE_LIB");
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(&local_d8,this,(ProKey *)local_88);
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if (local_c8 == (char16_t *)0x0) {
      QVar13.m_size = (size_t)"ar -rc";
      QVar13.field_0.m_data = &local_d8;
      QString::assign(QVar13);
    }
    ProKey::ProKey(&local_b8,"DEST_TARGET");
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(&local_118,this,&local_b8);
    qVar7 = local_108;
    pcVar6 = pcStack_110;
    pQVar2 = local_118;
    local_108 = 0;
    local_118 = (QArrayData *)0x0;
    pcStack_110 = (char16_t *)0x0;
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0xc])(&local_138,this,&this->linkerResponseFile);
    local_48 = local_128;
    pcStack_50 = pcStack_130;
    local_58 = local_138;
    local_88._0_8_ = &local_d8;
    local_88[8] = 0x20;
    local_78 = pQVar2;
    pcStack_70 = pcVar6;
    local_68 = qVar7;
    local_60 = (char (*) [3])0x2aeda0;
    local_138 = (QArrayData *)0x0;
    pcStack_130 = (char16_t *)0x0;
    local_128 = 0;
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
    ::convertTo<QString>
              (&local_f8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
                *)local_88);
    pQVar2 = &((this->objectsLinkLine).d.d)->super_QArrayData;
    pcVar6 = (this->objectsLinkLine).d.ptr;
    (this->objectsLinkLine).d.d = local_f8.d.d;
    (this->objectsLinkLine).d.ptr = local_f8.d.ptr;
    qVar7 = (this->objectsLinkLine).d.size;
    (this->objectsLinkLine).d.size = local_f8.d.size;
    local_f8.d.d = (Data *)pQVar2;
    local_f8.d.ptr = pcVar6;
    local_f8.d.size = qVar7;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
                       *)local_88);
    if (local_138 != (QArrayData *)0x0) {
      LOCK();
      (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_138,2,0x10);
      }
    }
    if (local_118 != (QArrayData *)0x0) {
      LOCK();
      (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_118,2,0x10);
      }
    }
    if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar2 = &(local_b8.super_ProString.m_string.d.d)->super_QArrayData;
joined_r0x001e12a8:
      if (iVar1 == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
    }
  }
LAB_001e12ea:
  Win32MakefileGenerator::writeObjectsPart(&this->super_Win32MakefileGenerator,t);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MingwMakefileGenerator::writeObjectsPart(QTextStream &t)
{
    linkerResponseFile = maybeCreateLinkerResponseFile();
    if (!linkerResponseFile.isValid()) {
        objectsLinkLine = "$(OBJECTS)";
    } else if (project->isActiveConfig("staticlib") && project->first("TEMPLATE") == "lib") {
        // QMAKE_LIB is used for win32, including mingw, whereas QMAKE_AR is used on Unix.
        QString ar_cmd = var("QMAKE_LIB");
        if (ar_cmd.isEmpty())
            ar_cmd = "ar -rc";
        objectsLinkLine = ar_cmd + ' ' + var("DEST_TARGET") + " @"
            + escapeFilePath(linkerResponseFile.filePath);
    } else {
        objectsLinkLine = "@" + escapeFilePath(linkerResponseFile.filePath);
    }
    Win32MakefileGenerator::writeObjectsPart(t);
}